

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

UfsType __thiscall
Clasp::DefaultUnfoundedCheck::findNonHcfUfs(DefaultUnfoundedCheck *this,Solver *s)

{
  uint uVar1;
  uint at;
  uint uVar2;
  uint uVar3;
  pointer ppNVar4;
  pointer puVar5;
  bool bVar6;
  uint uVar7;
  pointer ppNVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint local_38;
  
  ppNVar4 = (this->graph_->components_).ebo_.buf;
  ppNVar8 = ppNVar4 + *(uint *)(((this->mini_).ptr_ & 0xfffffffffffffffe) + 0x14);
  uVar11 = (ulong)(this->graph_->components_).ebo_.size;
  ppNVar4 = ppNVar4 + uVar11;
  while( true ) {
    iVar10 = (int)uVar11;
    uVar11 = (ulong)(iVar10 - 1);
    if (iVar10 == 0) {
      MinimalityCheck::schedNext
                ((MinimalityCheck *)((this->mini_).ptr_ & 0xfffffffffffffffe),
                 (s->levels_).super_type.ebo_.size,true);
      return ufs_none;
    }
    SolverStats::addTest
              (&s->stats,
               (s->assign_).assign_.ebo_.size !=
               (s->assign_).trail.ebo_.size + (s->assign_).elims_ + 1);
    Asp::PrgDepGraph::NonHcfComponent::assumptionsFromAssignment(*ppNVar8,s,&this->loopAtoms_);
    bVar6 = Asp::PrgDepGraph::NonHcfComponent::test(*ppNVar8,s,&this->loopAtoms_,&this->invalidQ_);
    if ((!bVar6) || ((s->conflict_).ebo_.size != 0)) break;
    ppNVar8 = ppNVar8 + 1;
    if (ppNVar8 == ppNVar4) {
      ppNVar8 = (this->graph_->components_).ebo_.buf;
    }
    (this->loopAtoms_).ebo_.size = 0;
  }
  puVar5 = (this->invalidQ_).ebo_.buf;
  uVar1 = (this->invalidQ_).ebo_.size;
  local_38 = 0xffffffff;
  uVar3 = 0;
  for (lVar9 = 0; (ulong)uVar1 << 2 != lVar9; lVar9 = lVar9 + 4) {
    at = *(uint *)((long)puVar5 + lVar9);
    uVar2 = (this->graph_->atoms_).ebo_.buf[at].super_Node.lit.rep_;
    uVar7 = *(uint *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar2 & 0xfffffffc));
    if (((byte)((byte)uVar7 & 3) == (byte)(2U - ((uVar2 & 2) == 0))) &&
       (uVar7 = uVar7 >> 4, uVar7 < local_38)) {
      uVar3 = (this->ufs_).vec.ebo_.size;
      local_38 = uVar7;
    }
    pushUfs(this,at);
  }
  if (uVar3 != 0) {
    puVar5 = (this->ufs_).vec.ebo_.buf;
    uVar1 = *puVar5;
    *puVar5 = puVar5[uVar3];
    puVar5[uVar3] = uVar1;
  }
  (this->invalidQ_).ebo_.size = 0;
  (this->loopAtoms_).ebo_.size = 0;
  *(int *)(((this->mini_).ptr_ & 0xfffffffffffffffe) + 0x14) =
       (int)((ulong)((long)ppNVar8 - (long)(this->graph_->components_).ebo_.buf) >> 3);
  return ufs_non_poly;
}

Assistant:

DefaultUnfoundedCheck::UfsType DefaultUnfoundedCheck::findNonHcfUfs(Solver& s) {
	assert(invalidQ_.empty() && loopAtoms_.empty());
	typedef DependencyGraph::NonHcfIter HccIter;
	HccIter hIt  = graph_->nonHcfBegin() + mini_->scc;
	HccIter hEnd = graph_->nonHcfEnd();
	for (uint32 checks = graph_->numNonHcfs(); checks--;) {
		s.stats.addTest(s.numFreeVars() != 0);
		(*hIt)->assumptionsFromAssignment(s, loopAtoms_);
		if (!(*hIt)->test(s, loopAtoms_, invalidQ_) || s.hasConflict()) {
			uint32 pos = 0, minDL = UINT32_MAX;
			for (VarVec::const_iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if (s.isTrue(graph_->getAtom(*it).lit) && s.level(graph_->getAtom(*it).lit.var()) < minDL) {
					minDL = s.level(graph_->getAtom(*it).lit.var());
					pos   = (uint32)ufs_.vec.size();
				}
				pushUfs(*it);
			}
			if (pos) {
				std::swap(ufs_.vec.front(), ufs_.vec[pos]);
			}
			invalidQ_.clear();
			loopAtoms_.clear();
			mini_->scc = static_cast<uint32>(hIt - graph_->nonHcfBegin());
			return ufs_non_poly;
		}
		if (++hIt == hEnd) { hIt = graph_->nonHcfBegin(); }
		loopAtoms_.clear();
	}
	mini_->schedNext(s.decisionLevel(), true);
	return ufs_none;
}